

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned-mem-pool.h
# Opt level: O0

void __thiscall cnn::AlignedMemoryPool::sys_alloc(AlignedMemoryPool *this,size_t cap)

{
  size_t sVar1;
  ulong uVar2;
  ostream *this_00;
  void *this_01;
  size_t in_RSI;
  ulong *in_RDI;
  
  sVar1 = MemAllocator::round_up_align((MemAllocator *)in_RDI[3],in_RSI);
  *in_RDI = sVar1;
  uVar2 = (**(code **)(*(long *)in_RDI[3] + 0x10))((long *)in_RDI[3],*in_RDI);
  in_RDI[4] = uVar2;
  if (in_RDI[4] == 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"Failed to allocate ");
    this_01 = (void *)std::ostream::operator<<(this_00,*in_RDI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    abort();
  }
  in_RDI[1] = 0;
  return;
}

Assistant:

void sys_alloc(size_t cap) {
    capacity = a->round_up_align(cap);
    //std::cerr << "Allocating " << capacity << " ...\n";
    mem = a->malloc(capacity);
    if (!mem) { std::cerr << "Failed to allocate " << capacity << std::endl; abort(); }
    used = 0;
  }